

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O0

int BuildHuffmanTable(HuffmanCode *root_table,int root_bits,int *code_lengths,int code_lengths_size,
                     uint16_t *sorted)

{
  int iVar1;
  undefined2 *puVar2;
  undefined2 uVar3;
  uint uVar4;
  int iVar5;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  HuffmanCode *in_RDI;
  undefined2 *in_R8;
  HuffmanCode code_2;
  HuffmanCode code_1;
  int table_size;
  int table_bits;
  int num_open;
  int num_nodes;
  uint32_t key;
  uint32_t mask;
  uint32_t low;
  int step;
  HuffmanCode code;
  int symbol_code_length;
  int offset [16];
  int count [16];
  int symbol;
  int len;
  int total_size;
  HuffmanCode *table;
  HuffmanCode local_f8;
  HuffmanCode local_f4;
  int local_f0;
  int local_e8;
  int local_e4;
  uint local_e0;
  uint local_d8;
  int local_d4;
  HuffmanCode local_d0;
  int aiStack_c8 [16];
  int local_88 [17];
  int local_44;
  int local_40;
  int local_3c;
  HuffmanCode *local_38;
  undefined2 *local_30;
  int local_24;
  long local_20;
  int local_14;
  HuffmanCode *local_10;
  int local_4;
  
  local_3c = 1 << ((byte)in_ESI & 0x1f);
  local_38 = in_RDI;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(local_88,0,0x40);
  for (local_44 = 0; local_44 < local_24; local_44 = local_44 + 1) {
    if (0xf < *(int *)(local_20 + (long)local_44 * 4)) {
      return 0;
    }
    iVar5 = *(int *)(local_20 + (long)local_44 * 4);
    local_88[iVar5] = local_88[iVar5] + 1;
  }
  if (local_88[0] == local_24) {
    local_4 = 0;
  }
  else {
    aiStack_c8[1] = 0;
    for (local_40 = 1; local_40 < 0xf; local_40 = local_40 + 1) {
      if (1 << ((byte)local_40 & 0x1f) < local_88[local_40]) {
        return 0;
      }
      aiStack_c8[local_40 + 1] = aiStack_c8[local_40] + local_88[local_40];
    }
    for (local_44 = 0; puVar2 = local_30, local_44 < local_24; local_44 = local_44 + 1) {
      iVar5 = *(int *)(local_20 + (long)local_44 * 4);
      if (0 < *(int *)(local_20 + (long)local_44 * 4)) {
        if (local_30 == (undefined2 *)0x0) {
          aiStack_c8[iVar5] = aiStack_c8[iVar5] + 1;
        }
        else {
          uVar3 = (undefined2)local_44;
          iVar1 = aiStack_c8[iVar5];
          aiStack_c8[iVar5] = iVar1 + 1;
          puVar2[iVar1] = uVar3;
        }
      }
    }
    if (aiStack_c8[0xf] == 1) {
      if (local_30 != (undefined2 *)0x0) {
        local_d0 = (HuffmanCode)(CONCAT22(*local_30,local_d0._0_2_) & 0xffffff00);
        ReplicateValue(local_38,1,local_3c,local_d0);
      }
      local_4 = local_3c;
    }
    else {
      local_d8 = 0xffffffff;
      uVar4 = local_3c - 1;
      local_e0 = 0;
      local_e4 = 1;
      local_e8 = 1;
      local_f0 = 1 << ((byte)local_14 & 0x1f);
      local_44 = 0;
      local_d4 = 2;
      for (local_40 = 1; local_40 <= local_14; local_40 = local_40 + 1) {
        local_e4 = local_e8 * 2 + local_e4;
        local_e8 = local_e8 * 2 - local_88[local_40];
        if (local_e8 < 0) {
          return 0;
        }
        if (local_10 != (HuffmanCode *)0x0) {
          while (0 < local_88[local_40]) {
            local_f4.bits = (char)local_40;
            local_f4.value = local_30[local_44];
            local_44 = local_44 + 1;
            ReplicateValue(local_38 + local_e0,local_d4,local_f0,local_f4);
            local_e0 = GetNextKey(local_e0,local_40);
            local_88[local_40] = local_88[local_40] + -1;
          }
        }
        local_d4 = local_d4 << 1;
      }
      local_d4 = 2;
      for (local_40 = local_14 + 1; local_40 < 0x10; local_40 = local_40 + 1) {
        local_e4 = local_e8 * 2 + local_e4;
        local_e8 = local_e8 * 2 - local_88[local_40];
        if (local_e8 < 0) {
          return 0;
        }
        if (local_10 != (HuffmanCode *)0x0) {
          while (0 < local_88[local_40]) {
            if ((local_e0 & uVar4) != local_d8) {
              local_38 = local_38 + local_f0;
              iVar5 = NextTableBitSize(local_88,local_40,local_14);
              local_f0 = 1 << ((byte)iVar5 & 0x1f);
              local_3c = local_f0 + local_3c;
              local_d8 = local_e0 & uVar4;
              local_10[local_d8].bits = (byte)iVar5 + (char)local_14;
              local_10[local_d8].value =
                   (short)((long)local_38 - (long)local_10 >> 2) - (short)local_d8;
            }
            local_f8.bits = (char)local_40 - (byte)local_14;
            local_f8.value = local_30[local_44];
            local_44 = local_44 + 1;
            ReplicateValue(local_38 + (local_e0 >> ((byte)local_14 & 0x1f)),local_d4,local_f0,
                           local_f8);
            local_e0 = GetNextKey(local_e0,local_40);
            local_88[local_40] = local_88[local_40] + -1;
          }
        }
        local_d4 = local_d4 << 1;
      }
      if (local_e4 == aiStack_c8[0xf] * 2 + -1) {
        local_4 = local_3c;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int BuildHuffmanTable(HuffmanCode* const root_table, int root_bits,
                             const int code_lengths[], int code_lengths_size,
                             uint16_t sorted[]) {
  HuffmanCode* table = root_table;  // next available space in table
  int total_size = 1 << root_bits;  // total size root table + 2nd level table
  int len;                          // current code length
  int symbol;                       // symbol index in original or sorted table
  // number of codes of each length:
  int count[MAX_ALLOWED_CODE_LENGTH + 1] = { 0 };
  // offsets in sorted table for each length:
  int offset[MAX_ALLOWED_CODE_LENGTH + 1];

  assert(code_lengths_size != 0);
  assert(code_lengths != NULL);
  assert((root_table != NULL && sorted != NULL) ||
         (root_table == NULL && sorted == NULL));
  assert(root_bits > 0);

  // Build histogram of code lengths.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    if (code_lengths[symbol] > MAX_ALLOWED_CODE_LENGTH) {
      return 0;
    }
    ++count[code_lengths[symbol]];
  }

  // Error, all code lengths are zeros.
  if (count[0] == code_lengths_size) {
    return 0;
  }

  // Generate offsets into sorted symbol table by code length.
  offset[1] = 0;
  for (len = 1; len < MAX_ALLOWED_CODE_LENGTH; ++len) {
    if (count[len] > (1 << len)) {
      return 0;
    }
    offset[len + 1] = offset[len] + count[len];
  }

  // Sort symbols by length, by symbol order within each length.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    const int symbol_code_length = code_lengths[symbol];
    if (code_lengths[symbol] > 0) {
      if (sorted != NULL) {
        sorted[offset[symbol_code_length]++] = symbol;
      } else {
        offset[symbol_code_length]++;
      }
    }
  }

  // Special case code with only one value.
  if (offset[MAX_ALLOWED_CODE_LENGTH] == 1) {
    if (sorted != NULL) {
      HuffmanCode code;
      code.bits = 0;
      code.value = (uint16_t)sorted[0];
      ReplicateValue(table, 1, total_size, code);
    }
    return total_size;
  }

  {
    int step;              // step size to replicate values in current table
    uint32_t low = -1;     // low bits for current root entry
    uint32_t mask = total_size - 1;    // mask for low bits
    uint32_t key = 0;      // reversed prefix code
    int num_nodes = 1;     // number of Huffman tree nodes
    int num_open = 1;      // number of open branches in current tree level
    int table_bits = root_bits;        // key length of current table
    int table_size = 1 << table_bits;  // size of current table
    symbol = 0;
    // Fill in root table.
    for (len = 1, step = 2; len <= root_bits; ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      if (root_table == NULL) continue;
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        code.bits = (uint8_t)len;
        code.value = (uint16_t)sorted[symbol++];
        ReplicateValue(&table[key], step, table_size, code);
        key = GetNextKey(key, len);
      }
    }

    // Fill in 2nd level tables and add pointers to root table.
    for (len = root_bits + 1, step = 2; len <= MAX_ALLOWED_CODE_LENGTH;
         ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      if (root_table == NULL) continue;
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        if ((key & mask) != low) {
          table += table_size;
          table_bits = NextTableBitSize(count, len, root_bits);
          table_size = 1 << table_bits;
          total_size += table_size;
          low = key & mask;
          root_table[low].bits = (uint8_t)(table_bits + root_bits);
          root_table[low].value = (uint16_t)((table - root_table) - low);
        }
        code.bits = (uint8_t)(len - root_bits);
        code.value = (uint16_t)sorted[symbol++];
        ReplicateValue(&table[key >> root_bits], step, table_size, code);
        key = GetNextKey(key, len);
      }
    }

    // Check if tree is full.
    if (num_nodes != 2 * offset[MAX_ALLOWED_CODE_LENGTH] - 1) {
      return 0;
    }
  }

  return total_size;
}